

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathRect(ImDrawList *this,ImVec2 *a,ImVec2 *b,float rounding,int rounding_corners)

{
  float fVar1;
  float fVar2;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_98;
  float local_84;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  float local_48;
  float local_44;
  float rounding_bl;
  float rounding_br;
  float rounding_tr;
  float rounding_tl;
  ImVec2 local_30;
  uint local_28;
  float local_24;
  int rounding_corners_local;
  float rounding_local;
  ImVec2 *b_local;
  ImVec2 *a_local;
  ImDrawList *this_local;
  
  local_28 = rounding_corners;
  local_24 = rounding;
  _rounding_corners_local = b;
  b_local = a;
  a_local = (ImVec2 *)this;
  fVar1 = ImFabs(b->x - a->x);
  local_84 = 0.5;
  if ((local_28 & 3) != 3 && (local_28 & 0xc) != 0xc) {
    local_84 = 1.0;
  }
  fVar1 = ImMin<float>(rounding,fVar1 * local_84 + -1.0);
  local_24 = fVar1;
  fVar2 = ImFabs(_rounding_corners_local->y - b_local->y);
  local_98 = 0.5;
  if ((local_28 & 5) != 5 && (local_28 & 10) != 10) {
    local_98 = 1.0;
  }
  local_24 = ImMin<float>(fVar1,fVar2 * local_98 + -1.0);
  if ((local_24 <= 0.0) || (local_28 == 0)) {
    PathLineTo(this,b_local);
    ImVec2::ImVec2(&local_30,_rounding_corners_local->x,b_local->y);
    PathLineTo(this,&local_30);
    PathLineTo(this,_rounding_corners_local);
    ImVec2::ImVec2((ImVec2 *)&rounding_tr,b_local->x,_rounding_corners_local->y);
    PathLineTo(this,(ImVec2 *)&rounding_tr);
  }
  else {
    local_a0 = local_24;
    if ((local_28 & 1) == 0) {
      local_a0 = 0.0;
    }
    rounding_br = local_a0;
    local_a4 = local_24;
    if ((local_28 & 2) == 0) {
      local_a4 = 0.0;
    }
    rounding_bl = local_a4;
    local_a8 = local_24;
    if ((local_28 & 8) == 0) {
      local_a8 = 0.0;
    }
    local_44 = local_a8;
    local_ac = local_24;
    if ((local_28 & 4) == 0) {
      local_ac = 0.0;
    }
    local_48 = local_ac;
    ImVec2::ImVec2(&local_50,b_local->x + local_a0,b_local->y + local_a0);
    PathArcToFast(this,&local_50,rounding_br,6,9);
    ImVec2::ImVec2(&local_58,_rounding_corners_local->x - rounding_bl,b_local->y + rounding_bl);
    PathArcToFast(this,&local_58,rounding_bl,9,0xc);
    ImVec2::ImVec2(&local_60,_rounding_corners_local->x - local_44,
                   _rounding_corners_local->y - local_44);
    PathArcToFast(this,&local_60,local_44,0,3);
    ImVec2::ImVec2(&local_68,b_local->x + local_48,_rounding_corners_local->y - local_48);
    PathArcToFast(this,&local_68,local_48,3,6);
  }
  return;
}

Assistant:

void ImDrawList::PathRect(const ImVec2& a, const ImVec2& b, float rounding, int rounding_corners)
{
    rounding = ImMin(rounding, ImFabs(b.x - a.x) * ( ((rounding_corners & ImDrawCornerFlags_Top)  == ImDrawCornerFlags_Top)  || ((rounding_corners & ImDrawCornerFlags_Bot)   == ImDrawCornerFlags_Bot)   ? 0.5f : 1.0f ) - 1.0f);
    rounding = ImMin(rounding, ImFabs(b.y - a.y) * ( ((rounding_corners & ImDrawCornerFlags_Left) == ImDrawCornerFlags_Left) || ((rounding_corners & ImDrawCornerFlags_Right) == ImDrawCornerFlags_Right) ? 0.5f : 1.0f ) - 1.0f);

    if (rounding <= 0.0f || rounding_corners == 0)
    {
        PathLineTo(a);
        PathLineTo(ImVec2(b.x, a.y));
        PathLineTo(b);
        PathLineTo(ImVec2(a.x, b.y));
    }
    else
    {
        const float rounding_tl = (rounding_corners & ImDrawCornerFlags_TopLeft) ? rounding : 0.0f;
        const float rounding_tr = (rounding_corners & ImDrawCornerFlags_TopRight) ? rounding : 0.0f;
        const float rounding_br = (rounding_corners & ImDrawCornerFlags_BotRight) ? rounding : 0.0f;
        const float rounding_bl = (rounding_corners & ImDrawCornerFlags_BotLeft) ? rounding : 0.0f;
        PathArcToFast(ImVec2(a.x + rounding_tl, a.y + rounding_tl), rounding_tl, 6, 9);
        PathArcToFast(ImVec2(b.x - rounding_tr, a.y + rounding_tr), rounding_tr, 9, 12);
        PathArcToFast(ImVec2(b.x - rounding_br, b.y - rounding_br), rounding_br, 0, 3);
        PathArcToFast(ImVec2(a.x + rounding_bl, b.y - rounding_bl), rounding_bl, 3, 6);
    }
}